

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte bVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  AABBNodeMB4D *node1;
  ulong uVar75;
  long lVar76;
  int iVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  ulong uVar88;
  ulong *puVar89;
  long lVar90;
  ulong uVar91;
  RTCIntersectArguments *pRVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar98;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar109;
  float fVar110;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar111 [32];
  float fVar115;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar116;
  undefined1 auVar114 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar124;
  float fVar128;
  undefined1 auVar122 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [64];
  undefined1 auVar129 [16];
  float fVar138;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar143 [16];
  float fVar139;
  float fVar148;
  float fVar149;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar150;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar171;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar162;
  float fVar166;
  float fVar168;
  float fVar170;
  undefined1 auVar159 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar182;
  float fVar186;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  float fVar188;
  undefined1 auVar187 [64];
  float fVar189;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar191 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar206;
  undefined1 auVar207 [32];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [64];
  float fVar215;
  float fVar216;
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar218 [64];
  float fVar231;
  float fVar233;
  undefined1 auVar232 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar237;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar239 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1884;
  undefined8 local_1880;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  undefined8 local_1860;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined1 local_1830 [8];
  float fStack_1828;
  float fStack_1824;
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  long local_1810;
  long local_1808;
  ulong local_1800;
  ulong local_17f8;
  long local_17f0;
  ulong local_17e8;
  uint local_17e0;
  uint local_17dc;
  float local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  uint local_17c8;
  uint local_17c4;
  uint local_17c0;
  RTCFilterFunctionNArguments local_17b0;
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [8];
  float fStack_15b8;
  float fStack_15b4;
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  undefined1 local_1560 [32];
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  undefined1 local_1520 [8];
  float fStack_1518;
  float fStack_1514;
  undefined4 uStack_1504;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  undefined1 local_1490 [8];
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [8];
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  undefined1 auVar137 [64];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_1200 != 8) && (fVar139 = ray->tfar, 0.0 <= fVar139)) {
    puVar89 = local_11f8;
    aVar5 = (ray->dir).field_0;
    auVar100 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar99._8_4_ = 0x7fffffff;
    auVar99._0_8_ = 0x7fffffff7fffffff;
    auVar99._12_4_ = 0x7fffffff;
    auVar99 = vandps_avx((undefined1  [16])aVar5,auVar99);
    auVar140._8_4_ = 0x219392ef;
    auVar140._0_8_ = 0x219392ef219392ef;
    auVar140._12_4_ = 0x219392ef;
    auVar99 = vcmpps_avx(auVar99,auVar140,1);
    auVar141._8_4_ = 0x3f800000;
    auVar141._0_8_ = 0x3f8000003f800000;
    auVar141._12_4_ = 0x3f800000;
    auVar140 = vdivps_avx(auVar141,(undefined1  [16])aVar5);
    auVar142._8_4_ = 0x5d5e0b6b;
    auVar142._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar142._12_4_ = 0x5d5e0b6b;
    auVar99 = vblendvps_avx(auVar140,auVar142,auVar99);
    auVar129._0_4_ = auVar99._0_4_ * 0.99999964;
    auVar129._4_4_ = auVar99._4_4_ * 0.99999964;
    auVar129._8_4_ = auVar99._8_4_ * 0.99999964;
    auVar129._12_4_ = auVar99._12_4_ * 0.99999964;
    uVar3 = *(undefined4 *)&(ray->org).field_0;
    auVar179 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar187 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar191 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    auVar117._0_4_ = auVar99._0_4_ * 1.0000004;
    auVar117._4_4_ = auVar99._4_4_ * 1.0000004;
    auVar117._8_4_ = auVar99._8_4_ * 1.0000004;
    auVar117._12_4_ = auVar99._12_4_ * 1.0000004;
    auVar99 = vshufps_avx(auVar129,auVar129,0);
    auVar205 = ZEXT3264(CONCAT1616(auVar99,auVar99));
    auVar99 = vmovshdup_avx(auVar129);
    auVar140 = vshufps_avx(auVar129,auVar129,0x55);
    auVar208 = ZEXT3264(CONCAT1616(auVar140,auVar140));
    auVar140 = vshufpd_avx(auVar129,auVar129,1);
    auVar141 = vshufps_avx(auVar129,auVar129,0xaa);
    auVar218 = ZEXT3264(CONCAT1616(auVar141,auVar141));
    auVar141 = vshufps_avx(auVar117,auVar117,0);
    auVar232 = ZEXT3264(CONCAT1616(auVar141,auVar141));
    auVar141 = vshufps_avx(auVar117,auVar117,0x55);
    auVar236 = ZEXT3264(CONCAT1616(auVar141,auVar141));
    auVar141 = vshufps_avx(auVar117,auVar117,0xaa);
    auVar123 = ZEXT1664(auVar141);
    auVar239 = ZEXT3264(CONCAT1616(auVar141,auVar141));
    uVar93 = (ulong)(auVar129._0_4_ < 0.0) * 0x20;
    uVar96 = (ulong)(auVar99._0_4_ < 0.0) << 5 | 0x40;
    uVar97 = (ulong)(auVar140._0_4_ < 0.0) << 5 | 0x80;
    auVar99 = vshufps_avx(auVar100,auVar100,0);
    auVar159 = ZEXT3264(CONCAT1616(auVar99,auVar99));
    auVar99 = vshufps_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),0);
    local_1420._16_16_ = auVar99;
    local_1420._0_16_ = auVar99;
    local_1440._16_16_ = mm_lookupmask_ps._240_16_;
    local_1440._0_16_ = mm_lookupmask_ps._0_16_;
    auVar114 = ZEXT3264(local_1440);
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar137 = ZEXT3264(auVar130);
    auVar101._8_4_ = 0xbf800000;
    auVar101._0_8_ = 0xbf800000bf800000;
    auVar101._12_4_ = 0xbf800000;
    auVar101._16_4_ = 0xbf800000;
    auVar101._20_4_ = 0xbf800000;
    auVar101._24_4_ = 0xbf800000;
    auVar101._28_4_ = 0xbf800000;
    local_1460 = vblendvps_avx(auVar130,auVar101,local_1440);
    do {
      uVar81 = puVar89[-1];
      puVar89 = puVar89 + -1;
      while( true ) {
        local_1600 = auVar179._0_32_;
        local_1620 = auVar187._0_32_;
        local_1640 = auVar191._0_32_;
        if ((uVar81 & 8) != 0) break;
        uVar75 = uVar81 & 0xfffffffffffffff0;
        fVar139 = (ray->dir).field_0.m128[3];
        auVar102._4_4_ = fVar139;
        auVar102._0_4_ = fVar139;
        auVar102._8_4_ = fVar139;
        auVar102._12_4_ = fVar139;
        auVar102._16_4_ = fVar139;
        auVar102._20_4_ = fVar139;
        auVar102._24_4_ = fVar139;
        auVar102._28_4_ = fVar139;
        pfVar2 = (float *)(uVar75 + 0x100 + uVar93);
        pfVar1 = (float *)(uVar75 + 0x40 + uVar93);
        auVar111._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar111._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar111._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar111._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar111._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar111._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar111._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar111._28_4_ = auVar114._28_4_ + pfVar1[7];
        auVar101 = vsubps_avx(auVar111,local_1600);
        auVar35._4_4_ = auVar205._4_4_ * auVar101._4_4_;
        auVar35._0_4_ = auVar205._0_4_ * auVar101._0_4_;
        auVar35._8_4_ = auVar205._8_4_ * auVar101._8_4_;
        auVar35._12_4_ = auVar205._12_4_ * auVar101._12_4_;
        auVar35._16_4_ = auVar205._16_4_ * auVar101._16_4_;
        auVar35._20_4_ = auVar205._20_4_ * auVar101._20_4_;
        auVar35._24_4_ = auVar205._24_4_ * auVar101._24_4_;
        auVar35._28_4_ = auVar101._28_4_;
        auVar101 = vmaxps_avx(auVar159._0_32_,auVar35);
        pfVar2 = (float *)(uVar75 + 0x100 + uVar96);
        pfVar1 = (float *)(uVar75 + 0x40 + uVar96);
        auVar119._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar119._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar119._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar119._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar119._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar119._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar119._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar119._28_4_ = auVar123._28_4_ + pfVar1[7];
        auVar130 = vsubps_avx(auVar119,local_1620);
        auVar36._4_4_ = auVar208._4_4_ * auVar130._4_4_;
        auVar36._0_4_ = auVar208._0_4_ * auVar130._0_4_;
        auVar36._8_4_ = auVar208._8_4_ * auVar130._8_4_;
        auVar36._12_4_ = auVar208._12_4_ * auVar130._12_4_;
        auVar36._16_4_ = auVar208._16_4_ * auVar130._16_4_;
        auVar36._20_4_ = auVar208._20_4_ * auVar130._20_4_;
        auVar36._24_4_ = auVar208._24_4_ * auVar130._24_4_;
        auVar36._28_4_ = auVar130._28_4_;
        pfVar2 = (float *)(uVar75 + 0x100 + uVar97);
        pfVar1 = (float *)(uVar75 + 0x40 + uVar97);
        auVar131._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar131._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar131._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar131._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar131._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar131._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar131._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar131._28_4_ = auVar137._28_4_ + pfVar1[7];
        auVar20 = vsubps_avx(auVar131,local_1640);
        auVar37._4_4_ = auVar218._4_4_ * auVar20._4_4_;
        auVar37._0_4_ = auVar218._0_4_ * auVar20._0_4_;
        auVar37._8_4_ = auVar218._8_4_ * auVar20._8_4_;
        auVar37._12_4_ = auVar218._12_4_ * auVar20._12_4_;
        auVar37._16_4_ = auVar218._16_4_ * auVar20._16_4_;
        auVar37._20_4_ = auVar218._20_4_ * auVar20._20_4_;
        auVar37._24_4_ = auVar218._24_4_ * auVar20._24_4_;
        auVar37._28_4_ = auVar20._28_4_;
        auVar130 = vmaxps_avx(auVar36,auVar37);
        auVar101 = vmaxps_avx(auVar101,auVar130);
        pfVar2 = (float *)(uVar75 + 0x100 + (uVar93 ^ 0x20));
        pfVar1 = (float *)(uVar75 + 0x40 + (uVar93 ^ 0x20));
        auVar120._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar120._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar120._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar120._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar120._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar120._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar120._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar120._28_4_ = auVar130._28_4_ + pfVar1[7];
        auVar130 = vsubps_avx(auVar120,local_1600);
        auVar38._4_4_ = auVar232._4_4_ * auVar130._4_4_;
        auVar38._0_4_ = auVar232._0_4_ * auVar130._0_4_;
        auVar38._8_4_ = auVar232._8_4_ * auVar130._8_4_;
        auVar38._12_4_ = auVar232._12_4_ * auVar130._12_4_;
        auVar38._16_4_ = auVar232._16_4_ * auVar130._16_4_;
        auVar38._20_4_ = auVar232._20_4_ * auVar130._20_4_;
        auVar38._24_4_ = auVar232._24_4_ * auVar130._24_4_;
        auVar38._28_4_ = auVar130._28_4_;
        pfVar2 = (float *)(uVar75 + 0x100 + (uVar96 ^ 0x20));
        auVar130 = vminps_avx(local_1420,auVar38);
        pfVar1 = (float *)(uVar75 + 0x40 + (uVar96 ^ 0x20));
        auVar132._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar132._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar132._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar132._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar132._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar132._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar132._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar132._28_4_ = auVar20._28_4_ + pfVar1[7];
        auVar20 = vsubps_avx(auVar132,local_1620);
        pfVar2 = (float *)(uVar75 + 0x100 + (uVar97 ^ 0x20));
        pfVar1 = (float *)(uVar75 + 0x40 + (uVar97 ^ 0x20));
        auVar144._0_4_ = fVar139 * *pfVar2 + *pfVar1;
        auVar144._4_4_ = fVar139 * pfVar2[1] + pfVar1[1];
        auVar144._8_4_ = fVar139 * pfVar2[2] + pfVar1[2];
        auVar144._12_4_ = fVar139 * pfVar2[3] + pfVar1[3];
        auVar144._16_4_ = fVar139 * pfVar2[4] + pfVar1[4];
        auVar144._20_4_ = fVar139 * pfVar2[5] + pfVar1[5];
        auVar144._24_4_ = fVar139 * pfVar2[6] + pfVar1[6];
        auVar144._28_4_ = local_1420._28_4_ + pfVar1[7];
        auVar39._4_4_ = auVar236._4_4_ * auVar20._4_4_;
        auVar39._0_4_ = auVar236._0_4_ * auVar20._0_4_;
        auVar39._8_4_ = auVar236._8_4_ * auVar20._8_4_;
        auVar39._12_4_ = auVar236._12_4_ * auVar20._12_4_;
        auVar39._16_4_ = auVar236._16_4_ * auVar20._16_4_;
        auVar39._20_4_ = auVar236._20_4_ * auVar20._20_4_;
        auVar39._24_4_ = auVar236._24_4_ * auVar20._24_4_;
        auVar39._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar144,local_1640);
        auVar40._4_4_ = auVar239._4_4_ * auVar20._4_4_;
        auVar40._0_4_ = auVar239._0_4_ * auVar20._0_4_;
        auVar40._8_4_ = auVar239._8_4_ * auVar20._8_4_;
        auVar40._12_4_ = auVar239._12_4_ * auVar20._12_4_;
        auVar40._16_4_ = auVar239._16_4_ * auVar20._16_4_;
        auVar40._20_4_ = auVar239._20_4_ * auVar20._20_4_;
        auVar40._24_4_ = auVar239._24_4_ * auVar20._24_4_;
        auVar40._28_4_ = auVar20._28_4_;
        auVar20 = vminps_avx(auVar39,auVar40);
        auVar137 = ZEXT3264(auVar20);
        auVar130 = vminps_avx(auVar130,auVar20);
        auVar101 = vcmpps_avx(auVar101,auVar130,2);
        auVar114 = ZEXT3264(auVar101);
        if (((uint)uVar81 & 7) == 6) {
          auVar130 = vcmpps_avx(*(undefined1 (*) [32])(uVar75 + 0x1c0),auVar102,2);
          auVar20 = vcmpps_avx(auVar102,*(undefined1 (*) [32])(uVar75 + 0x1e0),1);
          auVar20 = vandps_avx(auVar130,auVar20);
          auVar101 = vandps_avx(auVar20,auVar101);
          auVar114 = ZEXT1664(auVar101._16_16_);
          auVar99 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        }
        else {
          auVar99 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        }
        auVar123 = ZEXT3264(auVar130);
        auVar99 = vpsllw_avx(auVar99,0xf);
        if ((((((((auVar99 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar99 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar99 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar99 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar99[0xf]
           ) goto LAB_002ee32c;
        auVar99 = vpacksswb_avx(auVar99,auVar99);
        bVar34 = SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar99 >> 0x17,0) & 1) << 2 | (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar99 >> 0x27,0) & 1) << 4 | (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar99 >> 0x37,0) & 1) << 6 | SUB161(auVar99 >> 0x3f,0) << 7;
        lVar13 = 0;
        if (bVar34 != 0) {
          for (; (bVar34 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar81 = *(ulong *)(uVar75 + lVar13 * 8);
        uVar87 = bVar34 - 1 & (uint)bVar34;
        if (uVar87 != 0) {
          *puVar89 = uVar81;
          puVar89 = puVar89 + 1;
          lVar13 = 0;
          if (uVar87 != 0) {
            for (; (uVar87 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar81 = *(ulong *)(uVar75 + lVar13 * 8);
          uVar87 = uVar87 - 1 & uVar87;
          uVar78 = (ulong)uVar87;
          if (uVar87 != 0) {
            do {
              *puVar89 = uVar81;
              puVar89 = puVar89 + 1;
              lVar13 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar81 = *(ulong *)(uVar75 + lVar13 * 8);
              uVar78 = uVar78 & uVar78 - 1;
            } while (uVar78 != 0);
          }
        }
      }
      local_1810 = (ulong)((uint)uVar81 & 0xf) - 8;
      if (local_1810 != 0) {
        uVar81 = uVar81 & 0xfffffffffffffff0;
        pSVar8 = context->scene;
        local_1808 = 0;
        local_1660 = auVar205._0_32_;
        local_1680 = auVar208._0_32_;
        local_16a0 = auVar218._0_32_;
        local_16c0 = auVar232._0_32_;
        local_16e0 = auVar236._0_32_;
        local_1700 = auVar239._0_32_;
        local_1720 = auVar159._0_32_;
        do {
          lVar76 = local_1808 * 0x60;
          pRVar9 = (pSVar8->geometries).items;
          pGVar10 = pRVar9[*(uint *)(uVar81 + 0x40 + lVar76)].ptr;
          fVar139 = (pGVar10->time_range).lower;
          fVar139 = pGVar10->fnumTimeSegments *
                    (((ray->dir).field_0.m128[3] - fVar139) /
                    ((pGVar10->time_range).upper - fVar139));
          auVar99 = vroundss_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),9);
          auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
          auVar234 = vmaxss_avx(ZEXT816(0) << 0x20,auVar99);
          iVar77 = (int)auVar234._0_4_;
          lVar90 = (long)iVar77 * 0x38;
          lVar13 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar90);
          uVar88 = (ulong)*(uint *)(uVar81 + 4 + lVar76);
          auVar99 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar81 + lVar76) * 4);
          uVar78 = (ulong)*(uint *)(uVar81 + 0x10 + lVar76);
          auVar140 = *(undefined1 (*) [16])(lVar13 + uVar78 * 4);
          uVar80 = (ulong)*(uint *)(uVar81 + 0x20 + lVar76);
          auVar100 = *(undefined1 (*) [16])(lVar13 + uVar80 * 4);
          uVar82 = (ulong)*(uint *)(uVar81 + 0x30 + lVar76);
          auVar141 = *(undefined1 (*) [16])(lVar13 + uVar82 * 4);
          local_17f0 = *(long *)&pRVar9[*(uint *)(uVar81 + 0x44 + lVar76)].ptr[2].numPrimitives;
          lVar13 = *(long *)(local_17f0 + lVar90);
          auVar117 = *(undefined1 (*) [16])(lVar13 + uVar88 * 4);
          uVar83 = (ulong)*(uint *)(uVar81 + 0x14 + lVar76);
          auVar129 = *(undefined1 (*) [16])(lVar13 + uVar83 * 4);
          uVar84 = (ulong)*(uint *)(uVar81 + 0x24 + lVar76);
          auVar142 = *(undefined1 (*) [16])(lVar13 + uVar84 * 4);
          uVar85 = (ulong)*(uint *)(uVar81 + 0x34 + lVar76);
          auVar6 = *(undefined1 (*) [16])(lVar13 + uVar85 * 4);
          lVar13 = *(long *)&pRVar9[*(uint *)(uVar81 + 0x48 + lVar76)].ptr[2].numPrimitives;
          lVar11 = *(long *)(lVar13 + lVar90);
          uVar86 = (ulong)*(uint *)(uVar81 + 8 + lVar76);
          auVar143 = *(undefined1 (*) [16])(lVar11 + uVar86 * 4);
          local_17e8 = (ulong)*(uint *)(uVar81 + 0x18 + lVar76);
          auVar118 = *(undefined1 (*) [16])(lVar11 + local_17e8 * 4);
          uVar94 = CONCAT44(0,*(uint *)(uVar81 + 0x28 + lVar76));
          local_15e0._0_8_ = uVar94;
          auVar156 = *(undefined1 (*) [16])(lVar11 + uVar94 * 4);
          uVar95 = (ulong)*(uint *)(uVar81 + 0x38 + lVar76);
          auVar176 = *(undefined1 (*) [16])(lVar11 + uVar95 * 4);
          fVar139 = fVar139 - auVar234._0_4_;
          lVar11 = *(long *)&pRVar9[*(uint *)(uVar81 + 0x4c + lVar76)].ptr[2].numPrimitives;
          lVar90 = *(long *)(lVar11 + lVar90);
          uVar75 = (ulong)*(uint *)(uVar81 + 0xc + lVar76);
          auVar234 = *(undefined1 (*) [16])(lVar90 + uVar75 * 4);
          local_1800 = (ulong)*(uint *)(uVar81 + 0x1c + lVar76);
          auVar7 = *(undefined1 (*) [16])(lVar90 + local_1800 * 4);
          auVar26 = vunpcklps_avx(auVar99,auVar143);
          auVar143 = vunpckhps_avx(auVar99,auVar143);
          auVar27 = vunpcklps_avx(auVar117,auVar234);
          auVar117 = vunpckhps_avx(auVar117,auVar234);
          uVar91 = (ulong)*(uint *)(uVar81 + 0x2c + lVar76);
          auVar99 = *(undefined1 (*) [16])(lVar90 + uVar91 * 4);
          auVar234 = vunpcklps_avx(auVar143,auVar117);
          _local_1470 = vunpcklps_avx(auVar26,auVar27);
          auVar74 = _local_1470;
          auVar117 = vunpckhps_avx(auVar26,auVar27);
          auVar26 = vunpcklps_avx(auVar140,auVar118);
          auVar143 = vunpckhps_avx(auVar140,auVar118);
          auVar118 = vunpcklps_avx(auVar129,auVar7);
          auVar129 = vunpckhps_avx(auVar129,auVar7);
          local_17f8 = (ulong)*(uint *)(uVar81 + 0x3c + lVar76);
          auVar140 = *(undefined1 (*) [16])(lVar90 + local_17f8 * 4);
          auVar143 = vunpcklps_avx(auVar143,auVar129);
          auVar7 = vunpcklps_avx(auVar26,auVar118);
          auVar129 = vunpckhps_avx(auVar26,auVar118);
          auVar118 = vunpcklps_avx(auVar100,auVar156);
          auVar100 = vunpckhps_avx(auVar100,auVar156);
          auVar156 = vunpcklps_avx(auVar142,auVar99);
          auVar142 = vunpckhps_avx(auVar142,auVar99);
          lVar79 = (long)(iVar77 + 1) * 0x38;
          lVar90 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar79);
          auVar99 = *(undefined1 (*) [16])(lVar90 + (ulong)*(uint *)(uVar81 + lVar76) * 4);
          _local_1820 = vunpcklps_avx(auVar100,auVar142);
          auVar70 = _local_1820;
          _local_14a0 = vunpcklps_avx(auVar118,auVar156);
          auVar71 = _local_14a0;
          _local_1490 = vunpckhps_avx(auVar118,auVar156);
          auVar72 = _local_1490;
          auVar142 = vunpcklps_avx(auVar141,auVar176);
          auVar100 = vunpckhps_avx(auVar141,auVar176);
          auVar118 = vunpcklps_avx(auVar6,auVar140);
          auVar141 = vunpckhps_avx(auVar6,auVar140);
          lVar13 = *(long *)(lVar13 + lVar79);
          auVar140 = *(undefined1 (*) [16])(lVar13 + uVar86 * 4);
          _local_1830 = vunpcklps_avx(auVar100,auVar141);
          auVar69 = _local_1830;
          auVar156 = vunpcklps_avx(auVar142,auVar118);
          _local_1480 = vunpckhps_avx(auVar142,auVar118);
          auVar73 = _local_1480;
          lVar12 = *(long *)(local_17f0 + lVar79);
          auVar141 = vunpcklps_avx(auVar99,auVar140);
          auVar100 = vunpckhps_avx(auVar99,auVar140);
          auVar99 = *(undefined1 (*) [16])(lVar12 + uVar88 * 4);
          lVar11 = *(long *)(lVar11 + lVar79);
          auVar140 = *(undefined1 (*) [16])(lVar11 + uVar75 * 4);
          auVar142 = vunpcklps_avx(auVar99,auVar140);
          auVar99 = vunpckhps_avx(auVar99,auVar140);
          auVar118 = vunpcklps_avx(auVar100,auVar99);
          auVar176 = vunpcklps_avx(auVar141,auVar142);
          auVar100 = vunpckhps_avx(auVar141,auVar142);
          auVar99 = *(undefined1 (*) [16])(lVar90 + uVar78 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar13 + local_17e8 * 4);
          auVar142 = vunpcklps_avx(auVar99,auVar140);
          auVar141 = vunpckhps_avx(auVar99,auVar140);
          auVar99 = *(undefined1 (*) [16])(lVar12 + uVar83 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar11 + local_1800 * 4);
          auVar6 = vunpcklps_avx(auVar99,auVar140);
          auVar99 = vunpckhps_avx(auVar99,auVar140);
          auVar26 = vunpcklps_avx(auVar141,auVar99);
          auVar27 = vunpcklps_avx(auVar142,auVar6);
          auVar141 = vunpckhps_avx(auVar142,auVar6);
          auVar99 = *(undefined1 (*) [16])(lVar90 + uVar80 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar13 + uVar94 * 4);
          auVar6 = vunpcklps_avx(auVar99,auVar140);
          auVar142 = vunpckhps_avx(auVar99,auVar140);
          auVar99 = *(undefined1 (*) [16])(lVar12 + uVar84 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar11 + uVar91 * 4);
          auVar28 = vunpcklps_avx(auVar99,auVar140);
          auVar99 = vunpckhps_avx(auVar99,auVar140);
          auVar29 = vunpcklps_avx(auVar142,auVar99);
          auVar30 = vunpcklps_avx(auVar6,auVar28);
          auVar142 = vunpckhps_avx(auVar6,auVar28);
          auVar99 = *(undefined1 (*) [16])(lVar90 + uVar82 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar13 + uVar95 * 4);
          auVar28 = vunpcklps_avx(auVar99,auVar140);
          auVar6 = vunpckhps_avx(auVar99,auVar140);
          auVar99 = *(undefined1 (*) [16])(lVar12 + uVar85 * 4);
          auVar140 = *(undefined1 (*) [16])(lVar11 + local_17f8 * 4);
          auVar31 = vunpcklps_avx(auVar99,auVar140);
          auVar99 = vunpckhps_avx(auVar99,auVar140);
          auVar32 = vunpcklps_avx(auVar6,auVar99);
          auVar33 = vunpcklps_avx(auVar28,auVar31);
          auVar6 = vunpckhps_avx(auVar28,auVar31);
          auVar99 = vshufps_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),0);
          auVar140 = vshufps_avx(ZEXT416((uint)(1.0 - fVar139)),ZEXT416((uint)(1.0 - fVar139)),0);
          fVar139 = auVar99._0_4_;
          fVar17 = auVar99._4_4_;
          fVar18 = auVar99._8_4_;
          fVar19 = auVar99._12_4_;
          fVar109 = auVar140._0_4_;
          fVar115 = auVar140._4_4_;
          fVar116 = auVar140._8_4_;
          fVar124 = auVar140._12_4_;
          auVar112._4_4_ = fVar115 * (float)local_1470._4_4_ + auVar176._4_4_ * fVar17;
          auVar112._0_4_ = fVar109 * (float)local_1470._0_4_ + auVar176._0_4_ * fVar139;
          auVar112._8_4_ = fVar116 * fStack_1468 + auVar176._8_4_ * fVar18;
          auVar112._12_4_ = fVar124 * fStack_1464 + auVar176._12_4_ * fVar19;
          local_15a0._0_4_ = auVar117._0_4_;
          local_15a0._4_4_ = auVar117._4_4_;
          fStack_1598 = auVar117._8_4_;
          fStack_1594 = auVar117._12_4_;
          auVar133._4_4_ = fVar115 * (float)local_15a0._4_4_ + fVar17 * auVar100._4_4_;
          auVar133._0_4_ = fVar109 * (float)local_15a0._0_4_ + fVar139 * auVar100._0_4_;
          auVar133._8_4_ = fVar116 * fStack_1598 + fVar18 * auVar100._8_4_;
          auVar133._12_4_ = fVar124 * fStack_1594 + fVar19 * auVar100._12_4_;
          local_1540._0_4_ = auVar234._0_4_;
          local_1540._4_4_ = auVar234._4_4_;
          fStack_1538 = auVar234._8_4_;
          fStack_1534 = auVar234._12_4_;
          auVar172._4_4_ = fVar115 * (float)local_1540._4_4_ + auVar118._4_4_ * fVar17;
          auVar172._0_4_ = fVar109 * (float)local_1540._0_4_ + auVar118._0_4_ * fVar139;
          auVar172._8_4_ = fVar116 * fStack_1538 + auVar118._8_4_ * fVar18;
          auVar172._12_4_ = fVar124 * fStack_1534 + auVar118._12_4_ * fVar19;
          local_15c0._0_4_ = auVar7._0_4_;
          local_15c0._4_4_ = auVar7._4_4_;
          fStack_15b8 = auVar7._8_4_;
          fStack_15b4 = auVar7._12_4_;
          auVar176._0_4_ = fVar109 * (float)local_15c0._0_4_ + fVar139 * auVar27._0_4_;
          auVar176._4_4_ = fVar115 * (float)local_15c0._4_4_ + fVar17 * auVar27._4_4_;
          auVar176._8_4_ = fVar116 * fStack_15b8 + fVar18 * auVar27._8_4_;
          auVar176._12_4_ = fVar124 * fStack_15b4 + fVar19 * auVar27._12_4_;
          local_1580._0_4_ = auVar129._0_4_;
          local_1580._4_4_ = auVar129._4_4_;
          fStack_1578 = auVar129._8_4_;
          fStack_1574 = auVar129._12_4_;
          auVar118._0_4_ = fVar109 * (float)local_1580._0_4_ + auVar141._0_4_ * fVar139;
          auVar118._4_4_ = fVar115 * (float)local_1580._4_4_ + auVar141._4_4_ * fVar17;
          auVar118._8_4_ = fVar116 * fStack_1578 + auVar141._8_4_ * fVar18;
          auVar118._12_4_ = fVar124 * fStack_1574 + auVar141._12_4_ * fVar19;
          local_1520._0_4_ = auVar143._0_4_;
          local_1520._4_4_ = auVar143._4_4_;
          fStack_1518 = auVar143._8_4_;
          fStack_1514 = auVar143._12_4_;
          auVar234._0_4_ = fVar109 * (float)local_1520._0_4_ + auVar26._0_4_ * fVar139;
          auVar234._4_4_ = fVar115 * (float)local_1520._4_4_ + auVar26._4_4_ * fVar17;
          auVar234._8_4_ = fVar116 * fStack_1518 + auVar26._8_4_ * fVar18;
          auVar234._12_4_ = fVar124 * fStack_1514 + auVar26._12_4_ * fVar19;
          auVar112._20_4_ = fVar115 * (float)local_14a0._4_4_ + fVar17 * auVar30._4_4_;
          auVar112._16_4_ = fVar109 * (float)local_14a0._0_4_ + fVar139 * auVar30._0_4_;
          auVar112._24_4_ = fVar116 * fStack_1498 + fVar18 * auVar30._8_4_;
          auVar112._28_4_ = fVar124 * fStack_1494 + fVar19 * auVar30._12_4_;
          auVar133._20_4_ = fVar115 * (float)local_1490._4_4_ + auVar142._4_4_ * fVar17;
          auVar133._16_4_ = fVar109 * (float)local_1490._0_4_ + auVar142._0_4_ * fVar139;
          auVar133._24_4_ = fVar116 * fStack_1488 + auVar142._8_4_ * fVar18;
          auVar133._28_4_ = fVar124 * fStack_1484 + auVar142._12_4_ * fVar19;
          auVar172._20_4_ = fVar115 * (float)local_1820._4_4_ + auVar29._4_4_ * fVar17;
          auVar172._16_4_ = fVar109 * (float)local_1820._0_4_ + auVar29._0_4_ * fVar139;
          auVar172._24_4_ = fVar116 * fStack_1818 + auVar29._8_4_ * fVar18;
          auVar172._28_4_ = fVar124 * fStack_1814 + auVar29._12_4_ * fVar19;
          lVar13 = uVar81 + 0x40 + lVar76;
          local_13e0 = *(undefined8 *)(lVar13 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar13 + 0x18);
          auVar143._0_4_ = auVar156._0_4_ * fVar109 + fVar139 * auVar33._0_4_;
          auVar143._4_4_ = auVar156._4_4_ * fVar115 + fVar17 * auVar33._4_4_;
          auVar143._8_4_ = auVar156._8_4_ * fVar116 + fVar18 * auVar33._8_4_;
          auVar143._12_4_ = auVar156._12_4_ * fVar124 + fVar19 * auVar33._12_4_;
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar76 = uVar81 + 0x50 + lVar76;
          local_1400 = *(undefined8 *)(lVar76 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar76 + 0x18);
          auVar156._0_4_ = fVar109 * (float)local_1480._0_4_ + fVar139 * auVar6._0_4_;
          auVar156._4_4_ = fVar115 * (float)local_1480._4_4_ + fVar17 * auVar6._4_4_;
          auVar156._8_4_ = fVar116 * fStack_1478 + fVar18 * auVar6._8_4_;
          auVar156._12_4_ = fVar124 * fStack_1474 + fVar19 * auVar6._12_4_;
          auVar100._0_4_ = fVar109 * (float)local_1830._0_4_ + fVar139 * auVar32._0_4_;
          auVar100._4_4_ = fVar115 * (float)local_1830._4_4_ + fVar17 * auVar32._4_4_;
          auVar100._8_4_ = fVar116 * fStack_1828 + fVar18 * auVar32._8_4_;
          auVar100._12_4_ = fVar124 * fStack_1824 + fVar19 * auVar32._12_4_;
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar177._16_16_ = auVar176;
          auVar177._0_16_ = auVar176;
          auVar121._16_16_ = auVar118;
          auVar121._0_16_ = auVar118;
          auVar235._16_16_ = auVar234;
          auVar235._0_16_ = auVar234;
          auVar145._16_16_ = auVar143;
          auVar145._0_16_ = auVar143;
          auVar157._16_16_ = auVar156;
          auVar157._0_16_ = auVar156;
          auVar190._16_16_ = auVar100;
          auVar190._0_16_ = auVar100;
          uVar3 = *(undefined4 *)&(ray->org).field_0;
          auVar204._4_4_ = uVar3;
          auVar204._0_4_ = uVar3;
          auVar204._8_4_ = uVar3;
          auVar204._12_4_ = uVar3;
          auVar204._16_4_ = uVar3;
          auVar204._20_4_ = uVar3;
          auVar204._24_4_ = uVar3;
          auVar204._28_4_ = uVar3;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar207._4_4_ = uVar4;
          auVar207._0_4_ = uVar4;
          auVar207._8_4_ = uVar4;
          auVar207._12_4_ = uVar4;
          auVar207._16_4_ = uVar4;
          auVar207._20_4_ = uVar4;
          auVar207._24_4_ = uVar4;
          auVar207._28_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar217._4_4_ = uVar4;
          auVar217._0_4_ = uVar4;
          auVar217._8_4_ = uVar4;
          auVar217._12_4_ = uVar4;
          auVar217._16_4_ = uVar4;
          auVar217._20_4_ = uVar4;
          auVar217._24_4_ = uVar4;
          auVar217._28_4_ = uVar4;
          local_1740 = vsubps_avx(auVar112,auVar204);
          local_1760 = vsubps_avx(auVar133,auVar207);
          local_1780 = vsubps_avx(auVar172,auVar217);
          auVar101 = vsubps_avx(auVar177,auVar204);
          auVar130 = vsubps_avx(auVar121,auVar207);
          auVar20 = vsubps_avx(auVar235,auVar217);
          auVar112 = vsubps_avx(auVar145,auVar204);
          auVar113 = vsubps_avx(auVar157,auVar207);
          auVar21 = vsubps_avx(auVar190,auVar217);
          local_14c0 = vsubps_avx(auVar112,local_1740);
          local_14e0 = vsubps_avx(auVar113,local_1760);
          _local_1520 = vsubps_avx(auVar21,local_1780);
          fVar17 = local_1760._0_4_;
          fVar139 = auVar113._0_4_ + fVar17;
          fVar19 = local_1760._4_4_;
          fVar148 = auVar113._4_4_ + fVar19;
          fVar115 = local_1760._8_4_;
          fVar149 = auVar113._8_4_ + fVar115;
          fVar124 = local_1760._12_4_;
          fVar150 = auVar113._12_4_ + fVar124;
          fVar126 = local_1760._16_4_;
          fVar151 = auVar113._16_4_ + fVar126;
          fVar128 = local_1760._20_4_;
          fVar152 = auVar113._20_4_ + fVar128;
          fVar15 = local_1760._24_4_;
          fVar153 = auVar113._24_4_ + fVar15;
          fVar110 = local_1760._28_4_;
          fVar237 = local_1780._0_4_;
          fVar154 = fVar237 + auVar21._0_4_;
          fVar240 = local_1780._4_4_;
          fVar160 = fVar240 + auVar21._4_4_;
          fVar242 = local_1780._8_4_;
          fVar162 = fVar242 + auVar21._8_4_;
          fVar244 = local_1780._12_4_;
          fVar164 = fVar244 + auVar21._12_4_;
          fVar246 = local_1780._16_4_;
          fVar166 = fVar246 + auVar21._16_4_;
          fVar248 = local_1780._20_4_;
          fVar168 = fVar248 + auVar21._20_4_;
          fVar250 = local_1780._24_4_;
          fVar170 = fVar250 + auVar21._24_4_;
          fVar138 = local_1780._28_4_;
          fVar98 = local_1520._0_4_;
          fVar103 = local_1520._4_4_;
          auVar22._4_4_ = fVar103 * fVar148;
          auVar22._0_4_ = fVar98 * fVar139;
          fVar104 = local_1520._8_4_;
          auVar22._8_4_ = fVar104 * fVar149;
          fVar105 = local_1520._12_4_;
          auVar22._12_4_ = fVar105 * fVar150;
          fVar106 = local_1520._16_4_;
          auVar22._16_4_ = fVar106 * fVar151;
          fVar107 = local_1520._20_4_;
          auVar22._20_4_ = fVar107 * fVar152;
          fVar108 = local_1520._24_4_;
          auVar22._24_4_ = fVar108 * fVar153;
          auVar22._28_4_ = auVar176._12_4_;
          fVar215 = local_14e0._0_4_;
          fVar219 = local_14e0._4_4_;
          auVar23._4_4_ = fVar219 * fVar160;
          auVar23._0_4_ = fVar215 * fVar154;
          fVar221 = local_14e0._8_4_;
          auVar23._8_4_ = fVar221 * fVar162;
          fVar223 = local_14e0._12_4_;
          auVar23._12_4_ = fVar223 * fVar164;
          fVar225 = local_14e0._16_4_;
          auVar23._16_4_ = fVar225 * fVar166;
          fVar227 = local_14e0._20_4_;
          auVar23._20_4_ = fVar227 * fVar168;
          fVar229 = local_14e0._24_4_;
          auVar23._24_4_ = fVar229 * fVar170;
          auVar23._28_4_ = auVar100._12_4_;
          auVar22 = vsubps_avx(auVar23,auVar22);
          fVar18 = local_1740._0_4_;
          fVar175 = auVar112._0_4_ + fVar18;
          fVar109 = local_1740._4_4_;
          fVar180 = auVar112._4_4_ + fVar109;
          fVar116 = local_1740._8_4_;
          fVar181 = auVar112._8_4_ + fVar116;
          fVar125 = local_1740._12_4_;
          fVar182 = auVar112._12_4_ + fVar125;
          fVar127 = local_1740._16_4_;
          fVar183 = auVar112._16_4_ + fVar127;
          fVar14 = local_1740._20_4_;
          fVar184 = auVar112._20_4_ + fVar14;
          fVar16 = local_1740._24_4_;
          fVar185 = auVar112._24_4_ + fVar16;
          fVar206 = local_14c0._0_4_;
          fVar209 = local_14c0._4_4_;
          auVar24._4_4_ = fVar209 * fVar160;
          auVar24._0_4_ = fVar206 * fVar154;
          fVar210 = local_14c0._8_4_;
          auVar24._8_4_ = fVar210 * fVar162;
          fVar211 = local_14c0._12_4_;
          auVar24._12_4_ = fVar211 * fVar164;
          fVar212 = local_14c0._16_4_;
          auVar24._16_4_ = fVar212 * fVar166;
          fVar213 = local_14c0._20_4_;
          auVar24._20_4_ = fVar213 * fVar168;
          fVar214 = local_14c0._24_4_;
          auVar24._24_4_ = fVar214 * fVar170;
          auVar24._28_4_ = fVar138 + auVar21._28_4_;
          auVar121 = _local_1520;
          auVar25._4_4_ = fVar103 * fVar180;
          auVar25._0_4_ = fVar98 * fVar175;
          auVar25._8_4_ = fVar104 * fVar181;
          auVar25._12_4_ = fVar105 * fVar182;
          auVar25._16_4_ = fVar106 * fVar183;
          auVar25._20_4_ = fVar107 * fVar184;
          auVar25._24_4_ = fVar108 * fVar185;
          auVar25._28_4_ = uVar3;
          auVar23 = vsubps_avx(auVar25,auVar24);
          auVar41._4_4_ = fVar219 * fVar180;
          auVar41._0_4_ = fVar215 * fVar175;
          auVar41._8_4_ = fVar221 * fVar181;
          auVar41._12_4_ = fVar223 * fVar182;
          auVar41._16_4_ = fVar225 * fVar183;
          auVar41._20_4_ = fVar227 * fVar184;
          auVar41._24_4_ = fVar229 * fVar185;
          auVar41._28_4_ = auVar112._28_4_ + local_1740._28_4_;
          auVar42._4_4_ = fVar209 * fVar148;
          auVar42._0_4_ = fVar206 * fVar139;
          auVar42._8_4_ = fVar210 * fVar149;
          auVar42._12_4_ = fVar211 * fVar150;
          auVar42._16_4_ = fVar212 * fVar151;
          auVar42._20_4_ = fVar213 * fVar152;
          auVar42._24_4_ = fVar214 * fVar153;
          auVar42._28_4_ = auVar113._28_4_ + fVar110;
          auVar24 = vsubps_avx(auVar42,auVar41);
          local_1880._4_4_ = (ray->dir).field_0.m128[1];
          fVar139 = (ray->dir).field_0.m128[2];
          local_1500._4_4_ = fVar139;
          local_1500._0_4_ = fVar139;
          local_1500._8_4_ = fVar139;
          local_1500._12_4_ = fVar139;
          local_1500._16_4_ = fVar139;
          local_1500._20_4_ = fVar139;
          local_1500._24_4_ = fVar139;
          local_1500._28_4_ = fVar139;
          local_1860._4_4_ = (ray->dir).field_0.m128[0];
          local_1560._0_4_ =
               auVar22._0_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._0_4_ + fVar139 * auVar24._0_4_;
          local_1560._4_4_ =
               auVar22._4_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._4_4_ + fVar139 * auVar24._4_4_;
          local_1560._8_4_ =
               auVar22._8_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._8_4_ + fVar139 * auVar24._8_4_;
          local_1560._12_4_ =
               auVar22._12_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._12_4_ + fVar139 * auVar24._12_4_;
          local_1560._16_4_ =
               auVar22._16_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._16_4_ + fVar139 * auVar24._16_4_;
          local_1560._20_4_ =
               auVar22._20_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._20_4_ + fVar139 * auVar24._20_4_;
          local_1560._24_4_ =
               auVar22._24_4_ * local_1860._4_4_ +
               local_1880._4_4_ * auVar23._24_4_ + fVar139 * auVar24._24_4_;
          local_1560._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar24._28_4_;
          auVar22 = vsubps_avx(local_1760,auVar130);
          _local_1540 = vsubps_avx(local_1780,auVar20);
          fVar148 = auVar130._0_4_ + fVar17;
          fVar149 = auVar130._4_4_ + fVar19;
          fVar150 = auVar130._8_4_ + fVar115;
          fVar151 = auVar130._12_4_ + fVar124;
          fVar152 = auVar130._16_4_ + fVar126;
          fVar153 = auVar130._20_4_ + fVar128;
          fVar154 = auVar130._24_4_ + fVar15;
          fVar188 = auVar130._28_4_;
          fVar160 = fVar237 + auVar20._0_4_;
          fVar162 = fVar240 + auVar20._4_4_;
          fVar164 = fVar242 + auVar20._8_4_;
          fVar166 = fVar244 + auVar20._12_4_;
          fVar168 = fVar246 + auVar20._16_4_;
          fVar170 = fVar248 + auVar20._20_4_;
          fVar175 = fVar250 + auVar20._24_4_;
          fVar216 = local_1540._0_4_;
          fVar220 = local_1540._4_4_;
          auVar43._4_4_ = fVar220 * fVar149;
          auVar43._0_4_ = fVar216 * fVar148;
          fVar222 = local_1540._8_4_;
          auVar43._8_4_ = fVar222 * fVar150;
          fVar224 = local_1540._12_4_;
          auVar43._12_4_ = fVar224 * fVar151;
          fVar226 = local_1540._16_4_;
          auVar43._16_4_ = fVar226 * fVar152;
          fVar228 = local_1540._20_4_;
          auVar43._20_4_ = fVar228 * fVar153;
          fVar230 = local_1540._24_4_;
          auVar43._24_4_ = fVar230 * fVar154;
          auVar43._28_4_ = fVar138;
          fVar189 = auVar22._0_4_;
          fVar192 = auVar22._4_4_;
          auVar44._4_4_ = fVar192 * fVar162;
          auVar44._0_4_ = fVar189 * fVar160;
          fVar194 = auVar22._8_4_;
          auVar44._8_4_ = fVar194 * fVar164;
          fVar196 = auVar22._12_4_;
          auVar44._12_4_ = fVar196 * fVar166;
          fVar198 = auVar22._16_4_;
          auVar44._16_4_ = fVar198 * fVar168;
          fVar200 = auVar22._20_4_;
          auVar44._20_4_ = fVar200 * fVar170;
          fVar202 = auVar22._24_4_;
          auVar44._24_4_ = fVar202 * fVar175;
          auVar44._28_4_ = fVar110;
          auVar23 = vsubps_avx(auVar44,auVar43);
          auVar24 = vsubps_avx(local_1740,auVar101);
          fVar238 = auVar24._0_4_;
          fVar241 = auVar24._4_4_;
          auVar45._4_4_ = fVar241 * fVar162;
          auVar45._0_4_ = fVar238 * fVar160;
          fVar243 = auVar24._8_4_;
          auVar45._8_4_ = fVar243 * fVar164;
          fVar245 = auVar24._12_4_;
          auVar45._12_4_ = fVar245 * fVar166;
          fVar247 = auVar24._16_4_;
          auVar45._16_4_ = fVar247 * fVar168;
          fVar249 = auVar24._20_4_;
          auVar45._20_4_ = fVar249 * fVar170;
          fVar251 = auVar24._24_4_;
          auVar45._24_4_ = fVar251 * fVar175;
          auVar45._28_4_ = fVar138 + auVar20._28_4_;
          fVar160 = auVar101._0_4_ + fVar18;
          fVar162 = auVar101._4_4_ + fVar109;
          fVar164 = auVar101._8_4_ + fVar116;
          fVar166 = auVar101._12_4_ + fVar125;
          fVar168 = auVar101._16_4_ + fVar127;
          fVar170 = auVar101._20_4_ + fVar14;
          fVar175 = auVar101._24_4_ + fVar16;
          fVar186 = auVar101._28_4_ + local_1740._28_4_;
          auVar46._4_4_ = fVar220 * fVar162;
          auVar46._0_4_ = fVar216 * fVar160;
          auVar46._8_4_ = fVar222 * fVar164;
          auVar46._12_4_ = fVar224 * fVar166;
          auVar46._16_4_ = fVar226 * fVar168;
          auVar46._20_4_ = fVar228 * fVar170;
          auVar46._24_4_ = fVar230 * fVar175;
          auVar46._28_4_ = local_1540._28_4_;
          auVar24 = vsubps_avx(auVar46,auVar45);
          auVar47._4_4_ = fVar192 * fVar162;
          auVar47._0_4_ = fVar189 * fVar160;
          auVar47._8_4_ = fVar194 * fVar164;
          auVar47._12_4_ = fVar196 * fVar166;
          auVar47._16_4_ = fVar198 * fVar168;
          auVar47._20_4_ = fVar200 * fVar170;
          auVar47._24_4_ = fVar202 * fVar175;
          auVar47._28_4_ = fVar186;
          auVar48._4_4_ = fVar241 * fVar149;
          auVar48._0_4_ = fVar238 * fVar148;
          auVar48._8_4_ = fVar243 * fVar150;
          auVar48._12_4_ = fVar245 * fVar151;
          auVar48._16_4_ = fVar247 * fVar152;
          auVar48._20_4_ = fVar249 * fVar153;
          auVar48._24_4_ = fVar251 * fVar154;
          auVar48._28_4_ = fVar188 + fVar110;
          auVar25 = vsubps_avx(auVar48,auVar47);
          local_1580._0_4_ =
               local_1860._4_4_ * auVar23._0_4_ +
               local_1880._4_4_ * auVar24._0_4_ + fVar139 * auVar25._0_4_;
          local_1580._4_4_ =
               local_1860._4_4_ * auVar23._4_4_ +
               local_1880._4_4_ * auVar24._4_4_ + fVar139 * auVar25._4_4_;
          fStack_1578 = local_1860._4_4_ * auVar23._8_4_ +
                        local_1880._4_4_ * auVar24._8_4_ + fVar139 * auVar25._8_4_;
          fStack_1574 = local_1860._4_4_ * auVar23._12_4_ +
                        local_1880._4_4_ * auVar24._12_4_ + fVar139 * auVar25._12_4_;
          register0x00001310 =
               local_1860._4_4_ * auVar23._16_4_ +
               local_1880._4_4_ * auVar24._16_4_ + fVar139 * auVar25._16_4_;
          register0x00001314 =
               local_1860._4_4_ * auVar23._20_4_ +
               local_1880._4_4_ * auVar24._20_4_ + fVar139 * auVar25._20_4_;
          register0x00001318 =
               local_1860._4_4_ * auVar23._24_4_ +
               local_1880._4_4_ * auVar24._24_4_ + fVar139 * auVar25._24_4_;
          register0x0000131c = auVar23._28_4_ + auVar24._28_4_ + auVar25._28_4_;
          auVar23 = vsubps_avx(auVar101,auVar112);
          fVar154 = auVar101._0_4_ + auVar112._0_4_;
          fVar160 = auVar101._4_4_ + auVar112._4_4_;
          fVar162 = auVar101._8_4_ + auVar112._8_4_;
          fVar164 = auVar101._12_4_ + auVar112._12_4_;
          fVar166 = auVar101._16_4_ + auVar112._16_4_;
          fVar168 = auVar101._20_4_ + auVar112._20_4_;
          fVar170 = auVar101._24_4_ + auVar112._24_4_;
          fVar175 = auVar101._28_4_ + auVar112._28_4_;
          auVar101 = vsubps_avx(auVar130,auVar113);
          fVar110 = auVar130._0_4_ + auVar113._0_4_;
          fVar148 = auVar130._4_4_ + auVar113._4_4_;
          fVar149 = auVar130._8_4_ + auVar113._8_4_;
          fVar150 = auVar130._12_4_ + auVar113._12_4_;
          fVar151 = auVar130._16_4_ + auVar113._16_4_;
          fVar152 = auVar130._20_4_ + auVar113._20_4_;
          fVar153 = auVar130._24_4_ + auVar113._24_4_;
          auVar112 = vsubps_avx(auVar20,auVar21);
          fVar180 = auVar20._0_4_ + auVar21._0_4_;
          fVar181 = auVar20._4_4_ + auVar21._4_4_;
          fVar182 = auVar20._8_4_ + auVar21._8_4_;
          fVar183 = auVar20._12_4_ + auVar21._12_4_;
          fVar184 = auVar20._16_4_ + auVar21._16_4_;
          fVar185 = auVar20._20_4_ + auVar21._20_4_;
          fVar138 = auVar20._24_4_ + auVar21._24_4_;
          fVar155 = auVar112._0_4_;
          fVar161 = auVar112._4_4_;
          auVar49._4_4_ = fVar161 * fVar148;
          auVar49._0_4_ = fVar155 * fVar110;
          fVar163 = auVar112._8_4_;
          auVar49._8_4_ = fVar163 * fVar149;
          fVar165 = auVar112._12_4_;
          auVar49._12_4_ = fVar165 * fVar150;
          fVar167 = auVar112._16_4_;
          auVar49._16_4_ = fVar167 * fVar151;
          fVar169 = auVar112._20_4_;
          auVar49._20_4_ = fVar169 * fVar152;
          fVar171 = auVar112._24_4_;
          auVar49._24_4_ = fVar171 * fVar153;
          auVar49._28_4_ = fVar186;
          fVar186 = auVar101._0_4_;
          fVar193 = auVar101._4_4_;
          auVar50._4_4_ = fVar193 * fVar181;
          auVar50._0_4_ = fVar186 * fVar180;
          fVar195 = auVar101._8_4_;
          auVar50._8_4_ = fVar195 * fVar182;
          fVar197 = auVar101._12_4_;
          auVar50._12_4_ = fVar197 * fVar183;
          fVar199 = auVar101._16_4_;
          auVar50._16_4_ = fVar199 * fVar184;
          fVar201 = auVar101._20_4_;
          auVar50._20_4_ = fVar201 * fVar185;
          fVar203 = auVar101._24_4_;
          auVar50._24_4_ = fVar203 * fVar138;
          auVar50._28_4_ = fVar188;
          auVar101 = vsubps_avx(auVar50,auVar49);
          fVar231 = auVar23._0_4_;
          fVar233 = auVar23._4_4_;
          auVar51._4_4_ = fVar233 * fVar181;
          auVar51._0_4_ = fVar231 * fVar180;
          fVar180 = auVar23._8_4_;
          auVar51._8_4_ = fVar180 * fVar182;
          fVar181 = auVar23._12_4_;
          auVar51._12_4_ = fVar181 * fVar183;
          fVar182 = auVar23._16_4_;
          auVar51._16_4_ = fVar182 * fVar184;
          fVar183 = auVar23._20_4_;
          auVar51._20_4_ = fVar183 * fVar185;
          fVar184 = auVar23._24_4_;
          auVar51._24_4_ = fVar184 * fVar138;
          auVar51._28_4_ = auVar20._28_4_ + auVar21._28_4_;
          auVar20._4_4_ = fVar161 * fVar160;
          auVar20._0_4_ = fVar155 * fVar154;
          auVar20._8_4_ = fVar163 * fVar162;
          auVar20._12_4_ = fVar165 * fVar164;
          auVar20._16_4_ = fVar167 * fVar166;
          auVar20._20_4_ = fVar169 * fVar168;
          auVar20._24_4_ = fVar171 * fVar170;
          auVar20._28_4_ = fVar188;
          auVar130 = vsubps_avx(auVar20,auVar51);
          auVar21._4_4_ = fVar193 * fVar160;
          auVar21._0_4_ = fVar186 * fVar154;
          auVar21._8_4_ = fVar195 * fVar162;
          auVar21._12_4_ = fVar197 * fVar164;
          auVar21._16_4_ = fVar199 * fVar166;
          auVar21._20_4_ = fVar201 * fVar168;
          auVar21._24_4_ = fVar203 * fVar170;
          auVar21._28_4_ = fVar175;
          auVar52._4_4_ = fVar233 * fVar148;
          auVar52._0_4_ = fVar231 * fVar110;
          auVar52._8_4_ = fVar180 * fVar149;
          auVar52._12_4_ = fVar181 * fVar150;
          auVar52._16_4_ = fVar182 * fVar151;
          auVar52._20_4_ = fVar183 * fVar152;
          auVar52._24_4_ = fVar184 * fVar153;
          auVar52._28_4_ = fVar188 + auVar113._28_4_;
          auVar20 = vsubps_avx(auVar52,auVar21);
          local_1880._0_4_ = local_1880._4_4_;
          fStack_1878 = local_1880._4_4_;
          fStack_1874 = local_1880._4_4_;
          fStack_1870 = local_1880._4_4_;
          fStack_186c = local_1880._4_4_;
          fStack_1868 = local_1880._4_4_;
          fStack_1864 = local_1880._4_4_;
          local_1860._0_4_ = local_1860._4_4_;
          fStack_1858 = local_1860._4_4_;
          fStack_1854 = local_1860._4_4_;
          fStack_1850 = local_1860._4_4_;
          fStack_184c = local_1860._4_4_;
          fStack_1848 = local_1860._4_4_;
          fStack_1844 = local_1860._4_4_;
          auVar113._0_4_ =
               local_1860._4_4_ * auVar101._0_4_ +
               local_1880._4_4_ * auVar130._0_4_ + fVar139 * auVar20._0_4_;
          auVar113._4_4_ =
               local_1860._4_4_ * auVar101._4_4_ +
               local_1880._4_4_ * auVar130._4_4_ + fVar139 * auVar20._4_4_;
          auVar113._8_4_ =
               local_1860._4_4_ * auVar101._8_4_ +
               local_1880._4_4_ * auVar130._8_4_ + fVar139 * auVar20._8_4_;
          auVar113._12_4_ =
               local_1860._4_4_ * auVar101._12_4_ +
               local_1880._4_4_ * auVar130._12_4_ + fVar139 * auVar20._12_4_;
          auVar113._16_4_ =
               local_1860._4_4_ * auVar101._16_4_ +
               local_1880._4_4_ * auVar130._16_4_ + fVar139 * auVar20._16_4_;
          auVar113._20_4_ =
               local_1860._4_4_ * auVar101._20_4_ +
               local_1880._4_4_ * auVar130._20_4_ + fVar139 * auVar20._20_4_;
          auVar113._24_4_ =
               local_1860._4_4_ * auVar101._24_4_ +
               local_1880._4_4_ * auVar130._24_4_ + fVar139 * auVar20._24_4_;
          auVar113._28_4_ = fVar175 + fVar175 + auVar20._28_4_;
          local_15c0._0_4_ = auVar113._0_4_ + local_1560._0_4_ + (float)local_1580._0_4_;
          local_15c0._4_4_ = auVar113._4_4_ + local_1560._4_4_ + (float)local_1580._4_4_;
          fStack_15b8 = auVar113._8_4_ + local_1560._8_4_ + fStack_1578;
          fStack_15b4 = auVar113._12_4_ + local_1560._12_4_ + fStack_1574;
          register0x00001210 = auVar113._16_4_ + local_1560._16_4_ + register0x00001310;
          register0x00001214 = auVar113._20_4_ + local_1560._20_4_ + register0x00001314;
          register0x00001218 = auVar113._24_4_ + local_1560._24_4_ + register0x00001318;
          register0x0000121c = auVar113._28_4_ + local_1560._28_4_ + register0x0000131c;
          auVar101 = vminps_avx(local_1560,_local_1580);
          auVar101 = vminps_avx(auVar101,auVar113);
          auVar134._8_4_ = 0x7fffffff;
          auVar134._0_8_ = 0x7fffffff7fffffff;
          auVar134._12_4_ = 0x7fffffff;
          auVar134._16_4_ = 0x7fffffff;
          auVar134._20_4_ = 0x7fffffff;
          auVar134._24_4_ = 0x7fffffff;
          auVar134._28_4_ = 0x7fffffff;
          _local_15a0 = vandps_avx(_local_15c0,auVar134);
          fVar110 = local_15a0._0_4_ * 1.1920929e-07;
          fVar148 = local_15a0._4_4_ * 1.1920929e-07;
          local_1300._4_4_ = fVar148;
          local_1300._0_4_ = fVar110;
          fVar149 = local_15a0._8_4_ * 1.1920929e-07;
          local_1300._8_4_ = fVar149;
          fVar150 = local_15a0._12_4_ * 1.1920929e-07;
          local_1300._12_4_ = fVar150;
          fVar151 = local_15a0._16_4_ * 1.1920929e-07;
          local_1300._16_4_ = fVar151;
          fVar152 = local_15a0._20_4_ * 1.1920929e-07;
          local_1300._20_4_ = fVar152;
          fVar153 = local_15a0._24_4_ * 1.1920929e-07;
          local_1300._24_4_ = fVar153;
          local_1300._28_4_ = 0x34000000;
          auVar178._0_8_ = CONCAT44(fVar148,fVar110) ^ 0x8000000080000000;
          auVar178._8_4_ = -fVar149;
          auVar178._12_4_ = -fVar150;
          auVar178._16_4_ = -fVar151;
          auVar178._20_4_ = -fVar152;
          auVar178._24_4_ = -fVar153;
          auVar178._28_4_ = 0xb4000000;
          local_12a0 = vcmpps_avx(auVar101,auVar178,5);
          auVar130 = vmaxps_avx(local_1560,_local_1580);
          auVar101 = vmaxps_avx(auVar130,auVar113);
          auVar101 = vcmpps_avx(auVar101,local_1300,2);
          auVar114 = ZEXT3264(auVar101);
          auVar101 = vorps_avx(local_12a0,auVar101);
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0x7f,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0xbf,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar101[0x1f]) {
LAB_002ee294:
            auVar137 = ZEXT3264(local_1300);
            auVar123 = ZEXT3264(local_12a0);
            auVar179 = ZEXT3264(local_1600);
            auVar187 = ZEXT3264(local_1620);
            auVar191 = ZEXT3264(local_1640);
            auVar205 = ZEXT3264(local_1660);
            auVar208 = ZEXT3264(local_1680);
            auVar218 = ZEXT3264(local_16a0);
            auVar232 = ZEXT3264(local_16c0);
            auVar236 = ZEXT3264(local_16e0);
            auVar239 = ZEXT3264(local_1700);
            auVar159 = ZEXT3264(local_1720);
          }
          else {
            local_15e0 = auVar101;
            auVar53._4_4_ = fVar192 * fVar103;
            auVar53._0_4_ = fVar189 * fVar98;
            auVar53._8_4_ = fVar194 * fVar104;
            auVar53._12_4_ = fVar196 * fVar105;
            auVar53._16_4_ = fVar198 * fVar106;
            auVar53._20_4_ = fVar200 * fVar107;
            auVar53._24_4_ = fVar202 * fVar108;
            auVar53._28_4_ = local_12a0._28_4_;
            auVar54._4_4_ = fVar220 * fVar219;
            auVar54._0_4_ = fVar216 * fVar215;
            auVar54._8_4_ = fVar222 * fVar221;
            auVar54._12_4_ = fVar224 * fVar223;
            auVar54._16_4_ = fVar226 * fVar225;
            auVar54._20_4_ = fVar228 * fVar227;
            auVar54._24_4_ = fVar230 * fVar229;
            auVar54._28_4_ = 0x34000000;
            auVar113 = vsubps_avx(auVar54,auVar53);
            auVar55._4_4_ = fVar220 * fVar193;
            auVar55._0_4_ = fVar216 * fVar186;
            auVar55._8_4_ = fVar222 * fVar195;
            auVar55._12_4_ = fVar224 * fVar197;
            auVar55._16_4_ = fVar226 * fVar199;
            auVar55._20_4_ = fVar228 * fVar201;
            auVar55._24_4_ = fVar230 * fVar203;
            auVar55._28_4_ = auVar130._28_4_;
            auVar56._4_4_ = fVar192 * fVar161;
            auVar56._0_4_ = fVar189 * fVar155;
            auVar56._8_4_ = fVar194 * fVar163;
            auVar56._12_4_ = fVar196 * fVar165;
            auVar56._16_4_ = fVar198 * fVar167;
            auVar56._20_4_ = fVar200 * fVar169;
            auVar56._24_4_ = fVar202 * fVar171;
            auVar56._28_4_ = auVar22._28_4_;
            auVar21 = vsubps_avx(auVar56,auVar55);
            auVar146._8_4_ = 0x7fffffff;
            auVar146._0_8_ = 0x7fffffff7fffffff;
            auVar146._12_4_ = 0x7fffffff;
            auVar146._16_4_ = 0x7fffffff;
            auVar146._20_4_ = 0x7fffffff;
            auVar146._24_4_ = 0x7fffffff;
            auVar146._28_4_ = 0x7fffffff;
            auVar130 = vandps_avx(auVar53,auVar146);
            auVar20 = vandps_avx(auVar55,auVar146);
            auVar130 = vcmpps_avx(auVar130,auVar20,1);
            local_1360 = vblendvps_avx(auVar21,auVar113,auVar130);
            auVar57._4_4_ = fVar241 * fVar161;
            auVar57._0_4_ = fVar238 * fVar155;
            auVar57._8_4_ = fVar243 * fVar163;
            auVar57._12_4_ = fVar245 * fVar165;
            auVar57._16_4_ = fVar247 * fVar167;
            auVar57._20_4_ = fVar249 * fVar169;
            auVar57._24_4_ = fVar251 * fVar171;
            auVar57._28_4_ = auVar130._28_4_;
            auVar58._4_4_ = fVar241 * fVar103;
            auVar58._0_4_ = fVar238 * fVar98;
            auVar58._8_4_ = fVar243 * fVar104;
            auVar58._12_4_ = fVar245 * fVar105;
            auVar58._16_4_ = fVar247 * fVar106;
            auVar58._20_4_ = fVar249 * fVar107;
            auVar58._24_4_ = fVar251 * fVar108;
            auVar58._28_4_ = auVar113._28_4_;
            auVar59._4_4_ = fVar209 * fVar220;
            auVar59._0_4_ = fVar206 * fVar216;
            auVar59._8_4_ = fVar210 * fVar222;
            auVar59._12_4_ = fVar211 * fVar224;
            auVar59._16_4_ = fVar212 * fVar226;
            auVar59._20_4_ = fVar213 * fVar228;
            auVar59._24_4_ = fVar214 * fVar230;
            auVar59._28_4_ = fVar139;
            auVar113 = vsubps_avx(auVar58,auVar59);
            auVar60._4_4_ = fVar220 * fVar233;
            auVar60._0_4_ = fVar216 * fVar231;
            auVar60._8_4_ = fVar222 * fVar180;
            auVar60._12_4_ = fVar224 * fVar181;
            auVar60._16_4_ = fVar226 * fVar182;
            auVar60._20_4_ = fVar228 * fVar183;
            auVar60._24_4_ = fVar230 * fVar184;
            auVar60._28_4_ = auVar20._28_4_;
            auVar21 = vsubps_avx(auVar60,auVar57);
            auVar130 = vandps_avx(auVar59,auVar146);
            auVar20 = vandps_avx(auVar57,auVar146);
            auVar130 = vcmpps_avx(auVar130,auVar20,1);
            local_1340 = vblendvps_avx(auVar21,auVar113,auVar130);
            auVar61._4_4_ = fVar192 * fVar233;
            auVar61._0_4_ = fVar189 * fVar231;
            auVar61._8_4_ = fVar194 * fVar180;
            auVar61._12_4_ = fVar196 * fVar181;
            auVar61._16_4_ = fVar198 * fVar182;
            auVar61._20_4_ = fVar200 * fVar183;
            auVar61._24_4_ = fVar202 * fVar184;
            auVar61._28_4_ = auVar130._28_4_;
            auVar62._4_4_ = fVar209 * fVar192;
            auVar62._0_4_ = fVar206 * fVar189;
            auVar62._8_4_ = fVar210 * fVar194;
            auVar62._12_4_ = fVar211 * fVar196;
            auVar62._16_4_ = fVar212 * fVar198;
            auVar62._20_4_ = fVar213 * fVar200;
            auVar62._24_4_ = fVar214 * fVar202;
            auVar62._28_4_ = auVar113._28_4_;
            auVar63._4_4_ = fVar241 * fVar219;
            auVar63._0_4_ = fVar238 * fVar215;
            auVar63._8_4_ = fVar243 * fVar221;
            auVar63._12_4_ = fVar245 * fVar223;
            auVar63._16_4_ = fVar247 * fVar225;
            auVar63._20_4_ = fVar249 * fVar227;
            auVar63._24_4_ = fVar251 * fVar229;
            auVar63._28_4_ = auVar112._28_4_;
            auVar64._4_4_ = fVar241 * fVar193;
            auVar64._0_4_ = fVar238 * fVar186;
            auVar64._8_4_ = fVar243 * fVar195;
            auVar64._12_4_ = fVar245 * fVar197;
            auVar64._16_4_ = fVar247 * fVar199;
            auVar64._20_4_ = fVar249 * fVar201;
            auVar64._24_4_ = fVar251 * fVar203;
            auVar64._28_4_ = uStack_1504;
            auVar112 = vsubps_avx(auVar62,auVar63);
            auVar113 = vsubps_avx(auVar64,auVar61);
            auVar130 = vandps_avx(auVar63,auVar146);
            auVar20 = vandps_avx(auVar61,auVar146);
            auVar20 = vcmpps_avx(auVar130,auVar20,1);
            local_1320 = vblendvps_avx(auVar113,auVar112,auVar20);
            auVar99 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            fVar98 = local_1320._0_4_;
            fVar103 = local_1320._4_4_;
            fVar104 = local_1320._8_4_;
            fVar105 = local_1320._12_4_;
            fVar106 = local_1320._16_4_;
            fVar107 = local_1320._20_4_;
            fVar108 = local_1320._24_4_;
            fVar154 = local_1340._0_4_;
            fVar160 = local_1340._4_4_;
            fVar162 = local_1340._8_4_;
            fVar164 = local_1340._12_4_;
            fVar166 = local_1340._16_4_;
            fVar168 = local_1340._20_4_;
            fVar170 = local_1340._24_4_;
            fVar175 = local_1360._0_4_;
            fVar180 = local_1360._4_4_;
            fVar181 = local_1360._8_4_;
            fVar182 = local_1360._12_4_;
            fVar183 = local_1360._16_4_;
            fVar184 = local_1360._20_4_;
            fVar185 = local_1360._24_4_;
            fVar110 = fVar175 * local_1860._4_4_ + fVar154 * local_1880._4_4_ + fVar98 * fVar139;
            fVar148 = fVar180 * local_1860._4_4_ + fVar160 * local_1880._4_4_ + fVar103 * fVar139;
            fVar149 = fVar181 * local_1860._4_4_ + fVar162 * local_1880._4_4_ + fVar104 * fVar139;
            fVar150 = fVar182 * local_1860._4_4_ + fVar164 * local_1880._4_4_ + fVar105 * fVar139;
            fVar151 = fVar183 * local_1860._4_4_ + fVar166 * local_1880._4_4_ + fVar106 * fVar139;
            fVar152 = fVar184 * local_1860._4_4_ + fVar168 * local_1880._4_4_ + fVar107 * fVar139;
            fVar139 = fVar185 * local_1860._4_4_ + fVar170 * local_1880._4_4_ + fVar108 * fVar139;
            fVar153 = auVar112._28_4_ + auVar112._28_4_ + 0.0;
            auVar135._0_4_ = fVar110 + fVar110;
            auVar135._4_4_ = fVar148 + fVar148;
            auVar135._8_4_ = fVar149 + fVar149;
            auVar135._12_4_ = fVar150 + fVar150;
            auVar135._16_4_ = fVar151 + fVar151;
            auVar135._20_4_ = fVar152 + fVar152;
            auVar135._24_4_ = fVar139 + fVar139;
            auVar135._28_4_ = fVar153 + fVar153;
            fVar110 = auVar130._28_4_;
            auVar101 = vrcpps_avx(auVar135);
            fVar148 = fVar175 * fVar18 + fVar154 * fVar17 + fVar98 * fVar237;
            fVar149 = fVar180 * fVar109 + fVar160 * fVar19 + fVar103 * fVar240;
            fVar150 = fVar181 * fVar116 + fVar162 * fVar115 + fVar104 * fVar242;
            fVar124 = fVar182 * fVar125 + fVar164 * fVar124 + fVar105 * fVar244;
            fVar125 = fVar183 * fVar127 + fVar166 * fVar126 + fVar106 * fVar246;
            fVar126 = fVar184 * fVar14 + fVar168 * fVar128 + fVar107 * fVar248;
            fVar127 = fVar185 * fVar16 + fVar170 * fVar15 + fVar108 * fVar250;
            fVar128 = fVar110 + fVar110 + fVar153;
            fVar139 = auVar101._0_4_;
            fVar17 = auVar101._4_4_;
            auVar65._4_4_ = auVar135._4_4_ * fVar17;
            auVar65._0_4_ = auVar135._0_4_ * fVar139;
            fVar18 = auVar101._8_4_;
            auVar65._8_4_ = auVar135._8_4_ * fVar18;
            fVar19 = auVar101._12_4_;
            auVar65._12_4_ = auVar135._12_4_ * fVar19;
            fVar109 = auVar101._16_4_;
            auVar65._16_4_ = auVar135._16_4_ * fVar109;
            fVar115 = auVar101._20_4_;
            auVar65._20_4_ = auVar135._20_4_ * fVar115;
            fVar116 = auVar101._24_4_;
            auVar65._24_4_ = auVar135._24_4_ * fVar116;
            auVar65._28_4_ = fVar110;
            auVar147._8_4_ = 0x3f800000;
            auVar147._0_8_ = 0x3f8000003f800000;
            auVar147._12_4_ = 0x3f800000;
            auVar147._16_4_ = 0x3f800000;
            auVar147._20_4_ = 0x3f800000;
            auVar147._24_4_ = 0x3f800000;
            auVar147._28_4_ = 0x3f800000;
            auVar101 = vsubps_avx(auVar147,auVar65);
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar173._4_4_ = uVar3;
            auVar173._0_4_ = uVar3;
            auVar173._8_4_ = uVar3;
            auVar173._12_4_ = uVar3;
            auVar173._16_4_ = uVar3;
            auVar173._20_4_ = uVar3;
            auVar173._24_4_ = uVar3;
            auVar173._28_4_ = uVar3;
            local_12a0._4_4_ = (fVar149 + fVar149) * (fVar17 + fVar17 * auVar101._4_4_);
            local_12a0._0_4_ = (fVar148 + fVar148) * (fVar139 + fVar139 * auVar101._0_4_);
            local_12a0._8_4_ = (fVar150 + fVar150) * (fVar18 + fVar18 * auVar101._8_4_);
            local_12a0._12_4_ = (fVar124 + fVar124) * (fVar19 + fVar19 * auVar101._12_4_);
            local_12a0._16_4_ = (fVar125 + fVar125) * (fVar109 + fVar109 * auVar101._16_4_);
            local_12a0._20_4_ = (fVar126 + fVar126) * (fVar115 + fVar115 * auVar101._20_4_);
            local_12a0._24_4_ = (fVar127 + fVar127) * (fVar116 + fVar116 * auVar101._24_4_);
            local_12a0._28_4_ = fVar128 + fVar128;
            auVar101 = vcmpps_avx(auVar173,local_12a0,2);
            fVar139 = ray->tfar;
            auVar174._4_4_ = fVar139;
            auVar174._0_4_ = fVar139;
            auVar174._8_4_ = fVar139;
            auVar174._12_4_ = fVar139;
            auVar174._16_4_ = fVar139;
            auVar174._20_4_ = fVar139;
            auVar174._24_4_ = fVar139;
            auVar174._28_4_ = fVar139;
            auVar130 = vcmpps_avx(local_12a0,auVar174,2);
            auVar101 = vandps_avx(auVar130,auVar101);
            auVar130 = vcmpps_avx(auVar135,_DAT_01faff00,4);
            auVar101 = vandps_avx(auVar101,auVar130);
            auVar140 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar99 = vpand_avx(auVar140,auVar99);
            auVar114 = ZEXT1664(auVar99);
            auVar140 = vpmovsxwd_avx(auVar99);
            auVar100 = vpshufd_avx(auVar99,0xee);
            auVar100 = vpmovsxwd_avx(auVar100);
            local_1300._16_16_ = auVar100;
            local_1300._0_16_ = auVar140;
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar100 >> 0x3f,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar100[0xf]) goto LAB_002ee294;
            local_13c0 = local_1560._0_4_;
            fStack_13bc = local_1560._4_4_;
            fStack_13b8 = local_1560._8_4_;
            fStack_13b4 = local_1560._12_4_;
            fStack_13b0 = local_1560._16_4_;
            fStack_13ac = local_1560._20_4_;
            fStack_13a8 = local_1560._24_4_;
            fStack_13a4 = local_1560._28_4_;
            local_13a0 = (float)local_1580._0_4_;
            fStack_139c = (float)local_1580._4_4_;
            fStack_1398 = fStack_1578;
            fStack_1394 = fStack_1574;
            fStack_1390 = register0x00001310;
            fStack_138c = register0x00001314;
            fStack_1388 = register0x00001318;
            fStack_1384 = register0x0000131c;
            local_1380 = _local_15c0;
            local_1220 = local_1440;
            auVar101 = vrcpps_avx(_local_15c0);
            fVar139 = auVar101._0_4_;
            fVar17 = auVar101._4_4_;
            auVar66._4_4_ = (float)local_15c0._4_4_ * fVar17;
            auVar66._0_4_ = (float)local_15c0._0_4_ * fVar139;
            fVar18 = auVar101._8_4_;
            auVar66._8_4_ = fStack_15b8 * fVar18;
            fVar19 = auVar101._12_4_;
            auVar66._12_4_ = fStack_15b4 * fVar19;
            fVar109 = auVar101._16_4_;
            auVar66._16_4_ = register0x00001210 * fVar109;
            fVar115 = auVar101._20_4_;
            auVar66._20_4_ = register0x00001214 * fVar115;
            fVar116 = auVar101._24_4_;
            auVar66._24_4_ = register0x00001218 * fVar116;
            auVar66._28_4_ = auVar100._12_4_;
            auVar158._8_4_ = 0x3f800000;
            auVar158._0_8_ = 0x3f8000003f800000;
            auVar158._12_4_ = 0x3f800000;
            auVar158._16_4_ = 0x3f800000;
            auVar158._20_4_ = 0x3f800000;
            auVar158._24_4_ = 0x3f800000;
            auVar158._28_4_ = 0x3f800000;
            auVar130 = vsubps_avx(auVar158,auVar66);
            auVar122._0_4_ = fVar139 + fVar139 * auVar130._0_4_;
            auVar122._4_4_ = fVar17 + fVar17 * auVar130._4_4_;
            auVar122._8_4_ = fVar18 + fVar18 * auVar130._8_4_;
            auVar122._12_4_ = fVar19 + fVar19 * auVar130._12_4_;
            auVar122._16_4_ = fVar109 + fVar109 * auVar130._16_4_;
            auVar122._20_4_ = fVar115 + fVar115 * auVar130._20_4_;
            auVar122._24_4_ = fVar116 + fVar116 * auVar130._24_4_;
            auVar122._28_4_ = auVar101._28_4_ + auVar130._28_4_;
            auVar136._8_4_ = 0x219392ef;
            auVar136._0_8_ = 0x219392ef219392ef;
            auVar136._12_4_ = 0x219392ef;
            auVar136._16_4_ = 0x219392ef;
            auVar136._20_4_ = 0x219392ef;
            auVar136._24_4_ = 0x219392ef;
            auVar136._28_4_ = 0x219392ef;
            auVar130 = vcmpps_avx(_local_15a0,auVar136,5);
            auVar101 = vandps_avx(auVar130,auVar122);
            auVar67._4_4_ = local_1560._4_4_ * auVar101._4_4_;
            auVar67._0_4_ = local_1560._0_4_ * auVar101._0_4_;
            auVar67._8_4_ = local_1560._8_4_ * auVar101._8_4_;
            auVar67._12_4_ = local_1560._12_4_ * auVar101._12_4_;
            auVar67._16_4_ = local_1560._16_4_ * auVar101._16_4_;
            auVar67._20_4_ = local_1560._20_4_ * auVar101._20_4_;
            auVar67._24_4_ = local_1560._24_4_ * auVar101._24_4_;
            auVar67._28_4_ = auVar130._28_4_;
            auVar130 = vminps_avx(auVar67,auVar158);
            auVar68._4_4_ = (float)local_1580._4_4_ * auVar101._4_4_;
            auVar68._0_4_ = (float)local_1580._0_4_ * auVar101._0_4_;
            auVar68._8_4_ = fStack_1578 * auVar101._8_4_;
            auVar68._12_4_ = fStack_1574 * auVar101._12_4_;
            auVar68._16_4_ = register0x00001310 * auVar101._16_4_;
            auVar68._20_4_ = register0x00001314 * auVar101._20_4_;
            auVar68._24_4_ = register0x00001318 * auVar101._24_4_;
            auVar68._28_4_ = auVar101._28_4_;
            auVar101 = vminps_avx(auVar68,auVar158);
            auVar20 = vsubps_avx(auVar158,auVar130);
            auVar112 = vsubps_avx(auVar158,auVar101);
            local_12c0 = vblendvps_avx(auVar101,auVar20,local_1440);
            local_12e0 = vblendvps_avx(auVar130,auVar112,local_1440);
            fVar139 = local_1460._0_4_;
            fVar17 = local_1460._4_4_;
            local_1280._4_4_ = fVar180 * fVar17;
            local_1280._0_4_ = fVar175 * fVar139;
            fVar18 = local_1460._8_4_;
            local_1280._8_4_ = fVar181 * fVar18;
            fVar19 = local_1460._12_4_;
            local_1280._12_4_ = fVar182 * fVar19;
            fVar109 = local_1460._16_4_;
            local_1280._16_4_ = fVar183 * fVar109;
            fVar115 = local_1460._20_4_;
            local_1280._20_4_ = fVar184 * fVar115;
            fVar116 = local_1460._24_4_;
            local_1280._24_4_ = fVar185 * fVar116;
            local_1280._28_4_ = local_12c0._28_4_;
            auVar123 = ZEXT3264(local_1280);
            local_1260._4_4_ = fVar160 * fVar17;
            local_1260._0_4_ = fVar154 * fVar139;
            local_1260._8_4_ = fVar162 * fVar18;
            local_1260._12_4_ = fVar164 * fVar19;
            local_1260._16_4_ = fVar166 * fVar109;
            local_1260._20_4_ = fVar168 * fVar115;
            local_1260._24_4_ = fVar170 * fVar116;
            local_1260._28_4_ = local_12e0._28_4_;
            auVar137 = ZEXT3264(local_1260);
            local_1240[0] = fVar139 * fVar98;
            local_1240[1] = fVar17 * fVar103;
            local_1240[2] = fVar18 * fVar104;
            local_1240[3] = fVar19 * fVar105;
            fStack_1230 = fVar109 * fVar106;
            fStack_122c = fVar115 * fVar107;
            fStack_1228 = fVar116 * fVar108;
            uStack_1224 = local_1320._28_4_;
            auVar99 = vpsllw_avx(auVar99,0xf);
            auVar99 = vpacksswb_avx(auVar99,auVar99);
            uVar75 = (ulong)(byte)(SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar99 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar99 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar99 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar99 >> 0x3f,0) << 7);
            auVar179 = ZEXT3264(local_1600);
            auVar187 = ZEXT3264(local_1620);
            auVar191 = ZEXT3264(local_1640);
            auVar205 = ZEXT3264(local_1660);
            auVar208 = ZEXT3264(local_1680);
            auVar218 = ZEXT3264(local_16a0);
            auVar232 = ZEXT3264(local_16c0);
            auVar236 = ZEXT3264(local_16e0);
            auVar239 = ZEXT3264(local_1700);
            auVar159 = ZEXT3264(local_1720);
            _local_1830 = auVar69;
            _local_1820 = auVar70;
            _local_1520 = auVar121;
            _local_14a0 = auVar71;
            _local_1490 = auVar72;
            _local_1480 = auVar73;
            _local_1470 = auVar74;
            do {
              uVar78 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                }
              }
              local_17c8 = *(uint *)((long)&local_13e0 + uVar78 * 4);
              uVar80 = CONCAT44(0,local_17c8);
              local_1880 = uVar80;
              pGVar10 = (pSVar8->geometries).items[uVar80].ptr;
              if ((pGVar10->mask & ray->mask) == 0) {
                uVar75 = uVar75 ^ 1L << (uVar78 & 0x3f);
              }
              else {
                local_1860 = uVar78;
                pRVar92 = context->args;
                if ((pRVar92->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ee344;
                local_1740._0_8_ = uVar75;
                local_17b0.context = context->user;
                local_17e0 = *(uint *)(local_1280 + uVar78 * 4);
                auVar99 = ZEXT416(local_17e0);
                local_17dc = *(uint *)(local_1260 + uVar78 * 4);
                auVar140 = ZEXT416(local_17dc);
                local_17d8 = local_1240[uVar78];
                local_17d4 = *(undefined4 *)(local_12e0 + uVar78 * 4);
                local_17d0 = *(undefined4 *)(local_12c0 + uVar78 * 4);
                local_17cc = *(undefined4 *)((long)&local_1400 + uVar78 * 4);
                local_17c4 = (local_17b0.context)->instID[0];
                local_17c0 = (local_17b0.context)->instPrimID[0];
                local_1880._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_12a0 + uVar78 * 4);
                local_1884 = -1;
                local_17b0.valid = &local_1884;
                local_17b0.geometryUserPtr = pGVar10->userPtr;
                local_17b0.hit = (RTCHitN *)&local_17e0;
                local_17b0.N = 1;
                local_1760._0_8_ = pGVar10;
                local_17b0.ray = (RTCRayN *)ray;
                if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002ee19e:
                  if ((pRVar92->filter == (RTCFilterFunctionN)0x0) ||
                     (((pRVar92->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_1760._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002ee344:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  auVar123 = ZEXT1664(auVar99);
                  auVar137 = ZEXT1664(auVar140);
                  (*pRVar92->filter)(&local_17b0);
                  auVar114._8_56_ = extraout_var_00;
                  auVar114._0_8_ = extraout_XMM1_Qa_00;
                  if (*local_17b0.valid != 0) goto LAB_002ee344;
                }
                else {
                  local_1780._0_8_ = pRVar92;
                  auVar123 = ZEXT464(local_17e0);
                  auVar137 = ZEXT464(local_17dc);
                  (*pGVar10->occlusionFilterN)(&local_17b0);
                  auVar140 = auVar137._0_16_;
                  auVar99 = auVar123._0_16_;
                  auVar114._8_56_ = extraout_var;
                  auVar114._0_8_ = extraout_XMM1_Qa;
                  pRVar92 = (RTCIntersectArguments *)local_1780._0_8_;
                  if (*local_17b0.valid != 0) goto LAB_002ee19e;
                }
                ray->tfar = (float)local_1880;
                uVar75 = local_1740._0_8_ ^ 1L << (local_1860 & 0x3f);
                auVar179 = ZEXT3264(local_1600);
                auVar187 = ZEXT3264(local_1620);
                auVar191 = ZEXT3264(local_1640);
                auVar205 = ZEXT3264(local_1660);
                auVar208 = ZEXT3264(local_1680);
                auVar218 = ZEXT3264(local_16a0);
                auVar232 = ZEXT3264(local_16c0);
                auVar236 = ZEXT3264(local_16e0);
                auVar239 = ZEXT3264(local_1700);
                auVar159 = ZEXT3264(local_1720);
              }
            } while (uVar75 != 0);
          }
          local_1808 = local_1808 + 1;
        } while (local_1808 != local_1810);
      }
LAB_002ee32c:
    } while (puVar89 != &local_1200);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }